

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::upgrade(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
          *this,shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *connection)

{
  bool bVar1;
  result_type_conflict2 rVar2;
  element_type *peVar3;
  ostream *poVar4;
  element_type *peVar5;
  CaseInsensitiveMultimap *this_00;
  element_type *peVar6;
  pointer this_01;
  lowest_layer_type *this_02;
  InMessage *this_03;
  type s;
  element_type *b;
  anon_class_56_4_b0663a96_for_handler_ local_1698;
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage>
  local_1660;
  endpoint_type local_164c;
  reference local_1630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header_field;
  iterator __end0;
  iterator __begin0;
  CaseInsensitiveMultimap *__range2;
  undefined1 local_15f0 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  nonce_base64;
  size_t c;
  random_device rd;
  undefined1 local_248 [4];
  uniform_int_distribution<unsigned_short> dist;
  string nonce;
  undefined1 local_208 [8];
  ostream ostream;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> streambuf;
  string local_38 [8];
  string corrected_path;
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  *connection_local;
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  corrected_path.field_2._8_8_ = connection;
  std::__cxx11::string::string(local_38,(string *)&this->path);
  std::__cxx11::string::empty();
  std::make_shared<asio::basic_streambuf<std::allocator<char>>>();
  peVar3 = std::
           __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
           get((__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&ostream.field_0x108);
  std::ostream::ostream(local_208,&peVar3->super_streambuf);
  poVar4 = std::operator<<((ostream *)local_208,"GET ");
  poVar4 = std::operator<<(poVar4,local_38);
  std::operator<<(poVar4," HTTP/1.1\r\n");
  poVar4 = std::operator<<((ostream *)local_208,"Host: ");
  std::operator<<(poVar4,(string *)&this->host);
  if (this->port != this->default_port) {
    poVar4 = std::operator<<((ostream *)local_208,':');
    std::__cxx11::to_string((string *)((long)&nonce.field_2 + 8),(uint)this->port);
    std::operator<<(poVar4,(string *)(nonce.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(nonce.field_2._M_local_buf + 8));
  }
  std::operator<<((ostream *)local_208,"\r\n");
  std::operator<<((ostream *)local_208,"Upgrade: websocket\r\n");
  std::operator<<((ostream *)local_208,"Connection: Upgrade\r\n");
  std::__cxx11::string::string((string *)local_248);
  std::__cxx11::string::reserve((ulong)local_248);
  std::uniform_int_distribution<unsigned_short>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_short> *)((long)&rd.field_0 + 0x1384),0,0xff);
  std::random_device::random_device((random_device *)&c);
  for (nonce_base64.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      nonce_base64.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
      nonce_base64.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(nonce_base64.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    rVar2 = std::uniform_int_distribution<unsigned_short>::operator()
                      ((uniform_int_distribution<unsigned_short> *)((long)&rd.field_0 + 0x1384),
                       (random_device *)&c);
    std::__cxx11::string::operator+=((string *)local_248,(char)rVar2);
  }
  Crypto::Base64::encode((string *)&__range2,(string *)local_248);
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15f0);
  std::__cxx11::string::~string((string *)&__range2);
  poVar4 = std::operator<<((ostream *)local_208,"Sec-WebSocket-Key: ");
  peVar5 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_15f0);
  poVar4 = std::operator<<(poVar4,(string *)peVar5);
  std::operator<<(poVar4,"\r\n");
  std::operator<<((ostream *)local_208,"Sec-WebSocket-Version: 13\r\n");
  this_00 = &(this->config).header;
  __end0 = std::
           unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_00);
  header_field = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                              *)&header_field), bVar1) {
    local_1630 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                 ::operator*(&__end0);
    poVar4 = std::operator<<((ostream *)local_208,(string *)local_1630);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)&local_1630->second);
    std::operator<<(poVar4,"\r\n");
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator++(&__end0);
  }
  std::operator<<((ostream *)local_208,"\r\n");
  peVar6 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)corrected_path.field_2._8_8_);
  this_01 = std::
            unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
            ::operator->(&peVar6->socket);
  this_02 = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
            lowest_layer(this_01);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint(&local_164c,this_02);
  peVar6 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)corrected_path.field_2._8_8_);
  asio::ip::basic_endpoint<asio::ip::tcp>::operator=(&peVar6->endpoint,&local_164c);
  this_03 = (InMessage *)operator_new(0x188);
  InMessage::InMessage(this_03);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::InMessage>
  ::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::InMessage,void>
            ((shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::InMessage>
              *)&local_1660,this_03);
  peVar6 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)corrected_path.field_2._8_8_);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage>
  ::operator=(&peVar6->in_message,&local_1660);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage>
  ::~shared_ptr(&local_1660);
  peVar6 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)corrected_path.field_2._8_8_);
  Connection::set_timeout(peVar6,(this->config).timeout_request);
  peVar6 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)corrected_path.field_2._8_8_);
  s = std::
      unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
      ::operator*(&peVar6->socket);
  b = std::
      __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&ostream.field_0x108);
  local_1698.this = this;
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::shared_ptr(&local_1698.connection,
               (shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *)corrected_path.field_2._8_8_);
  std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
            (&local_1698.streambuf,
             (shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)&ostream.field_0x108);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&local_1698.nonce_base64,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_15f0);
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>,std::allocator<char>,SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::upgrade(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (s,b,&local_1698);
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
  ::
  upgrade(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>const&)
  ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_std__error_code_const__unsigned_long__1_ *)&local_1698);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_15f0);
  std::random_device::~random_device((random_device *)&c);
  std::__cxx11::string::~string((string *)local_248);
  std::ostream::~ostream(local_208);
  std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)&ostream.field_0x108);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void upgrade(const std::shared_ptr<Connection> &connection) {
      auto corrected_path = path;
      if(!config.proxy_server.empty() && std::is_same<socket_type, asio::ip::tcp::socket>::value)
        corrected_path = "http://" + host + ':' + std::to_string(port) + corrected_path;

      auto streambuf = std::make_shared<asio::streambuf>();
      std::ostream ostream(streambuf.get());
      ostream << "GET " << corrected_path << " HTTP/1.1\r\n";
      ostream << "Host: " << host;
      if(port != default_port)
        ostream << ':' << std::to_string(port);
      ostream << "\r\n";
      ostream << "Upgrade: websocket\r\n";
      ostream << "Connection: Upgrade\r\n";

      // Make random 16-byte nonce
      std::string nonce;
      nonce.reserve(16);
      std::uniform_int_distribution<unsigned short> dist(0, 255);
      std::random_device rd;
      for(std::size_t c = 0; c < 16; c++)
        nonce += static_cast<char>(dist(rd));

      auto nonce_base64 = std::make_shared<std::string>(Crypto::Base64::encode(nonce));
      ostream << "Sec-WebSocket-Key: " << *nonce_base64 << "\r\n";
      ostream << "Sec-WebSocket-Version: 13\r\n";
      for(auto &header_field : config.header)
        ostream << header_field.first << ": " << header_field.second << "\r\n";
      ostream << "\r\n";

      try {
        connection->endpoint = connection->socket->lowest_layer().remote_endpoint();
      }
      catch(...) {
      }

      connection->in_message = std::shared_ptr<InMessage>(new InMessage());

      connection->set_timeout(config.timeout_request);
      asio::async_write(*connection->socket, *streambuf, [this, connection, streambuf, nonce_base64](const error_code &ec, std::size_t /*bytes_transferred*/) {
        connection->cancel_timeout();
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec) {
          connection->set_timeout(this->config.timeout_request);
          asio::async_read_until(*connection->socket, connection->in_message->streambuf, "\r\n\r\n", [this, connection, nonce_base64](const error_code &ec, std::size_t bytes_transferred) {
            connection->cancel_timeout();
            auto lock = connection->handler_runner->continue_lock();
            if(!lock)
              return;
            if(!ec) {
              // connection->in_message->streambuf.size() is not necessarily the same as bytes_transferred, from Boost-docs:
              // "After a successful async_read_until operation, the streambuf may contain additional data beyond the delimiter"
              // The chosen solution is to extract lines from the stream directly when parsing the header. What is left of the
              // streambuf (maybe some bytes of a message) is appended to in the next async_read-function
              std::size_t num_additional_bytes = connection->in_message->streambuf.size() - bytes_transferred;

              if(!ResponseMessage::parse(*connection->in_message, connection->http_version, connection->status_code, connection->header)) {
                this->connection_error(connection, make_error_code::make_error_code(errc::protocol_error));
                return;
              }
              if(connection->status_code.compare(0, 4, "101 ") != 0) {
                this->connection_error(connection, make_error_code::make_error_code(errc::permission_denied));
                return;
              }
              auto header_it = connection->header.find("Sec-WebSocket-Accept");
              static auto ws_magic_string = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
              if(header_it != connection->header.end() &&
                 Crypto::Base64::decode(header_it->second) == Crypto::sha1(*nonce_base64 + ws_magic_string)) {
                this->connection_open(connection);
                read_message(connection, num_additional_bytes);
              }
              else
                this->connection_error(connection, make_error_code::make_error_code(errc::protocol_error));
            }
            else
              this->connection_error(connection, ec);
          });
        }
        else
          this->connection_error(connection, ec);
      });
    }